

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_device_do_operation__null(ma_device *pDevice,ma_uint32 operation)

{
  ma_uint32 *pmVar1;
  undefined1 *puVar2;
  ma_uint32 mVar3;
  ma_context *pmVar4;
  ma_bool32 mVar5;
  
  LOCK();
  pmVar1 = &(pDevice->field_23).null_device.operation;
  mVar3 = *pmVar1;
  *pmVar1 = operation;
  UNLOCK();
  pmVar4 = (pDevice->field_23).null_device.operationEvent.pContext;
  if (pmVar4 != (ma_context *)0x0) {
    puVar2 = (undefined1 *)((long)&pDevice->field_23 + 0x18);
    (*(pmVar4->field_22).posix.pthread_mutex_lock)(puVar2,mVar3);
    *(undefined4 *)((long)&pDevice->field_23 + 0x70) = 1;
    (*(((pDevice->field_23).null_device.operationEvent.pContext)->field_22).posix.
      pthread_cond_signal)((undefined1 *)((long)&pDevice->field_23 + 0x40));
    (*(((pDevice->field_23).null_device.operationEvent.pContext)->field_22).posix.
      pthread_mutex_unlock)(puVar2);
    mVar5 = ma_event_wait(&(pDevice->field_23).null_device.operationCompletionEvent);
    return mVar5;
  }
  return 0;
}

Assistant:

static ma_result ma_device_do_operation__null(ma_device* pDevice, ma_uint32 operation)
{
    ma_atomic_exchange_32(&pDevice->null_device.operation, operation);
    if (!ma_event_signal(&pDevice->null_device.operationEvent)) {
        return MA_ERROR;
    }

    if (!ma_event_wait(&pDevice->null_device.operationCompletionEvent)) {
        return MA_ERROR;
    }

    return pDevice->null_device.operationResult;
}